

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_sll_h_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = (ulong)wd * 0x10;
  lVar2 = (ulong)ws * 0x10;
  lVar3 = (ulong)wt * 0x10;
  *(short *)((env->active_fpu).fpr + wd) =
       (short)((env->active_fpu).fpr[ws].fs[0] << (*(byte *)((env->active_fpu).fpr + wt) & 0xf));
  *(short *)((long)(env->active_fpu).fpr + lVar1 + 2) =
       *(short *)((long)(env->active_fpu).fpr + lVar2 + 2) <<
       (*(byte *)((long)(env->active_fpu).fpr + lVar3 + 2) & 0xf);
  *(short *)((long)(env->active_fpu).fpr + lVar1 + 4) =
       (short)(*(int *)((long)(env->active_fpu).fpr + lVar2 + 4) <<
              (*(byte *)((long)(env->active_fpu).fpr + lVar3 + 4) & 0xf));
  *(short *)((long)(env->active_fpu).fpr + lVar1 + 6) =
       *(short *)((long)(env->active_fpu).fpr + lVar2 + 6) <<
       (*(byte *)((long)(env->active_fpu).fpr + lVar3 + 6) & 0xf);
  *(short *)((long)(env->active_fpu).fpr + lVar1 + 8) =
       (short)(*(int *)((long)(env->active_fpu).fpr + lVar2 + 8) <<
              (*(byte *)((long)(env->active_fpu).fpr + lVar3 + 8) & 0xf));
  *(short *)((long)(env->active_fpu).fpr + lVar1 + 10) =
       *(short *)((long)(env->active_fpu).fpr + lVar2 + 10) <<
       (*(byte *)((long)(env->active_fpu).fpr + lVar3 + 10) & 0xf);
  *(short *)((long)(env->active_fpu).fpr + lVar1 + 0xc) =
       (short)(*(int *)((long)(env->active_fpu).fpr + lVar2 + 0xc) <<
              (*(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xc) & 0xf));
  *(short *)((long)(env->active_fpu).fpr + lVar1 + 0xe) =
       *(short *)((long)(env->active_fpu).fpr + lVar2 + 0xe) <<
       (*(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xe) & 0xf);
  return;
}

Assistant:

void helper_msa_sll_h(CPUMIPSState *env,
                      uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_sll_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_sll_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_sll_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_sll_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_sll_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_sll_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_sll_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_sll_df(DF_HALF, pws->h[7],  pwt->h[7]);
}